

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_class_decl(gvisitor_t *self,gnode_class_decl_t *node)

{
  gnode_class_decl_t *node_00;
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  gravity_class_t *pgVar7;
  gnode_t *pgVar8;
  symboltable_t *table;
  void *pvVar9;
  ulong uVar10;
  gnode_t *pgVar11;
  char *format;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  size_t i;
  ulong uVar15;
  long lVar16;
  gnode_t *node_01;
  ulong local_50;
  
  pgVar8 = *(gnode_t **)((*self->data)[2] + -8 + **self->data * 8);
  check_access_storage_specifiers(self,&node->base,pgVar8->tag,node->access,node->storage);
  node->env = pgVar8;
  iVar6 = string_cmp(node->identifier,"init");
  if (iVar6 == 0) {
    format = "%s is a special name and cannot be used as class identifier.";
    pcVar12 = "init";
LAB_0011ecf1:
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,format,pcVar12);
    return;
  }
  node_00 = (gnode_class_decl_t *)node->superclass;
  if (node_00 == (gnode_class_decl_t *)0x0) goto LAB_0011ee1a;
  node->superclass = (gnode_t *)0x0;
  pgVar7 = gravity_core_class_from_name(*(char **)&node_00->bridge);
  pcVar12 = *(char **)&node_00->bridge;
  if (pgVar7 != (gravity_class_t *)0x0) {
    format = "Unable to subclass built-in core class %s.";
    node = node_00;
    goto LAB_0011ecf1;
  }
  pgVar8 = lookup_identifier(self,pcVar12,(gnode_identifier_expr_t *)node_00);
  if (pgVar8 == (gnode_t *)0x0) {
    pgVar11 = *(gnode_t **)&node_00->bridge;
    pcVar12 = "%s %s not found.";
LAB_0011ed75:
    pgVar8 = (gnode_t *)0x0;
    report_error(self,GRAVITY_ERROR_SEMANTIC,(gnode_t *)node_00,pcVar12,"Class",pgVar11);
  }
  else {
    pgVar11 = node_00->env;
    if (pgVar11 != (gnode_t *)0x0) {
      table = symtable_from_node(pgVar8);
      if (table == (symboltable_t *)0x0) {
        pgVar8 = (gnode_t *)0x0;
      }
      else {
        pgVar8 = symboltable_lookup(table,(char *)pgVar11);
      }
      if (pgVar8 == (gnode_t *)0x0) {
        pgVar11 = node_00->env;
        pcVar12 = "%s %s not found in %s.";
        goto LAB_0011ed75;
      }
    }
  }
  node->superclass = pgVar8;
  if (pgVar8 == (gnode_t *)0x0) {
    pcVar12 = "Unable to find superclass %s for class %s.";
LAB_0011edf8:
    report_error(self,GRAVITY_ERROR_SEMANTIC,(gnode_t *)node_00,pcVar12,*(char **)&node_00->bridge,
                 node->identifier);
  }
  else {
    pgVar8 = gnode2class(pgVar8,&node->super_extern);
    if (pgVar8 == (gnode_t *)0x0) {
      pcVar12 = "Unable to set non class %s as superclass of %s.";
      goto LAB_0011edf8;
    }
    if (*(gnode_class_decl_t **)&pgVar8[1].token.bytes == node) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,(gnode_t *)node_00,
                   "Unable to set circular class hierarchies (%s <-> %s).",
                   *(char **)&node_00->bridge,node->identifier);
      gnode_free((gnode_t *)node_00);
      return;
    }
  }
  gnode_free((gnode_t *)node_00);
LAB_0011ee1a:
  plVar1 = *self->data;
  lVar16 = plVar1[1];
  if (*plVar1 == lVar16) {
    lVar14 = 8;
    if (lVar16 != 0) {
      lVar14 = lVar16 * 2;
    }
    plVar1[1] = lVar14;
    pvVar9 = realloc((void *)plVar1[2],lVar14 << 3);
    *(void **)(*self->data + 0x10) = pvVar9;
  }
  plVar1 = *self->data;
  lVar16 = *plVar1;
  *plVar1 = lVar16 + 1;
  *(gnode_class_decl_t **)(plVar1[2] + lVar16 * 8) = node;
  if (node->decls == (gnode_r *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = node->decls->n;
  }
  if (uVar10 != 0) {
    uVar13 = 0;
    do {
      if (uVar13 < node->decls->n) {
        pgVar8 = node->decls->p[uVar13];
      }
      else {
        pgVar8 = (gnode_t *)0x0;
      }
      pgVar11 = node->superclass;
      if ((pgVar11 != (gnode_t *)0x0) && (pgVar8->tag == NODE_VARIABLE_DECL)) {
        if (*(ulong **)&pgVar8[1].token == (ulong *)0x0) {
          local_50 = 0;
        }
        else {
          local_50 = **(ulong **)&pgVar8[1].token;
        }
        if ((pgVar11->tag == NODE_CLASS_DECL) && (local_50 != 0)) {
          uVar15 = 0;
          do {
            if (uVar15 < **(ulong **)&pgVar8[1].token) {
              lVar16 = *(long *)((*(ulong **)&pgVar8[1].token)[2] + uVar15 * 8);
            }
            else {
              lVar16 = 0;
            }
            bVar5 = false;
            if ((lVar16 != 0) &&
               (iVar6 = string_cmp(*(char **)(lVar16 + 0x50),"outer"), node_01 = pgVar11, iVar6 != 0
               )) {
              do {
                if (node_01 == (gnode_t *)0x0) {
                  bVar5 = false;
                  pgVar11 = (gnode_t *)0x0;
                  goto LAB_0011efe5;
                }
                pgVar11 = symboltable_lookup((symboltable_t *)node_01[1].decl,
                                             *(char **)(lVar16 + 0x50));
                if (pgVar11 != (gnode_t *)0x0) {
                  uVar2._0_4_ = node_01[1].token.colno;
                  uVar2._4_4_ = node_01[1].token.position;
                  report_error(self,GRAVITY_WARNING,pgVar8,
                               "Property \'%s\' defined in class \'%s\' already defined in its superclass %s."
                               ,*(undefined8 *)(lVar16 + 0x50),node->identifier,uVar2);
                }
                pgVar11 = *(gnode_t **)&node_01[1].token.bytes;
                bVar5 = true;
                if ((pgVar11 != (gnode_t *)0x0) && (pgVar11->tag != NODE_CLASS_DECL)) {
                  uVar3._0_4_ = node_01[1].token.colno;
                  uVar3._4_4_ = node_01[1].token.position;
                  uVar4._0_4_ = pgVar11[1].tag;
                  uVar4._4_4_ = pgVar11[1].refcount;
                  bVar5 = false;
                  report_error(self,GRAVITY_ERROR_SEMANTIC,node_01,
                               "Unable to find superclass %s for class %s.",uVar3,uVar4);
                  node_01[1].token.bytes = 0;
                  node_01[1].token.length = 0;
                  pgVar11 = node_01;
                }
                node_01 = pgVar11;
              } while (bVar5);
              bVar5 = true;
            }
LAB_0011efe5:
          } while ((!bVar5) && (uVar15 = uVar15 + 1, uVar15 != local_50));
        }
      }
      gvisit(self,pgVar8);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar10);
  }
  lVar16 = **self->data;
  if (lVar16 != 0) {
    **self->data = lVar16 + -1;
  }
  return;
}

Assistant:

static void visit_class_decl (gvisitor_t *self, gnode_class_decl_t *node) {
    DEBUG_CODEGEN("visit_class_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    // create a new pair of classes (class itself and its meta)
    gravity_class_t *c = gravity_class_new_pair(GET_VM(), node->identifier, NULL, node->nivar, node->nsvar);

    // mark the class as a struct
    c->is_struct = node->is_struct;
    
    // check if class has a declared superclass
    if (node->superclass) {
        // node->superclass should be a gnode_class_decl_t at this point
        if (NODE_ISA_CLASS(node->superclass)) {
            node->super_extern = (((gnode_class_decl_t *)node->superclass)->storage == TOK_KEY_EXTERN);
        } else {
            node->superclass = gnode2class((gnode_t*)node->superclass, &node->super_extern);
            if (!node->superclass) report_error(self, (gnode_t*)node, "Unable to set superclass to non class object.");
        }
        
        if (node->super_extern) {
            gravity_class_setsuper_extern(c, gnode_identifier((gnode_t*)node->superclass));
        } else {
            gnode_class_decl_t *super = (gnode_class_decl_t *)node->superclass;
            if (super->data) {
                // means that superclass has already been processed and its runtime representation is available
                gravity_class_setsuper(c, (gravity_class_t *)super->data);
            } else {
                // superclass has not yet processed so we need recheck the node at the end of the visit
                // add node to superfix for later processing
                codegen_t *data = (codegen_t *)self->data;
                node->data = (void *)c;
                marray_push(gnode_class_decl_t *, data->superfix, node);
            }
        }
    }

    CONTEXT_PUSH(c);

    // process inner declarations
    gnode_array_each(node->decls, {visit(val);});

    // adjust declaration stack
    CONTEXT_POP();

    // fix constructor chain
    process_constructor(self, c, (gnode_t *)node);

    // store class declaration in current context
    store_declaration(self, (gravity_object_t *)c, (node->storage == TOK_KEY_STATIC), NULL);

    // save runtime representation
    // since this class could be a superclass of another class
    // then save opaque gravity_class_t pointer to node->data
    node->data = (void *)c;
}